

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

cmCPackIFWPackage * __thiscall
cmCPackIFWGenerator::GetGroupPackage(cmCPackIFWGenerator *this,cmCPackComponentGroup *group)

{
  const_iterator cVar1;
  cmCPackIFWPackage *pcVar2;
  cmCPackComponentGroup *local_10;
  
  local_10 = group;
  cVar1 = std::
          _Rb_tree<cmCPackComponentGroup_*,_std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>,_std::_Select1st<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>,_std::less<cmCPackComponentGroup_*>,_std::allocator<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>_>
          ::find(&(this->GroupPackages)._M_t,&local_10);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->GroupPackages)._M_t._M_impl.super__Rb_tree_header)
  {
    pcVar2 = (cmCPackIFWPackage *)0x0;
  }
  else {
    pcVar2 = (cmCPackIFWPackage *)cVar1._M_node[1]._M_parent;
  }
  return pcVar2;
}

Assistant:

cmCPackIFWPackage* cmCPackIFWGenerator::GetGroupPackage(
  cmCPackComponentGroup* group) const
{
  auto pit = this->GroupPackages.find(group);
  return pit != this->GroupPackages.end() ? pit->second : nullptr;
}